

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O1

QUrl __thiscall
QNetworkRequestFactoryPrivate::requestUrl
          (QNetworkRequestFactoryPrivate *this,QString *path,QUrlQuery *query)

{
  qsizetype *pqVar1;
  int *piVar2;
  char cVar3;
  ParsingMode PVar4;
  QUrlQuery *in_RCX;
  QList<std::pair<QString,_QString>_> *__range2;
  QString *pQVar5;
  pair<QString,_QString> *item;
  type *key;
  QString *pQVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QUrlQuery pathQueryItems;
  QUrlQuery resultQuery;
  QUrlQuery providedQuery;
  QUrl providedPath;
  QArrayDataPointer<std::pair<QString,_QString>_> local_c8;
  undefined1 *local_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 *local_98;
  undefined1 *local_88;
  QArrayData *local_80 [2];
  long local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 *local_58;
  undefined1 *local_48;
  QUrl local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  if (query == (QUrlQuery *)0x0) {
    QUrl::QUrl(&local_40);
  }
  else {
    QUrl::QUrl(&local_40,(QString *)query,TolerantMode);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RCX == (QUrlQuery *)0x0) {
    QUrlQuery::QUrlQuery((QUrlQuery *)&local_48);
  }
  else {
    QUrlQuery::QUrlQuery((QUrlQuery *)&local_48,in_RCX);
  }
  QUrl::scheme();
  bVar7 = true;
  if (local_58 == (undefined1 *)0x0) {
    QUrl::host(local_80,&local_40,0x7f00000);
    bVar7 = local_70 != 0;
    if (local_80[0] != (QArrayData *)0x0) {
      LOCK();
      (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80[0],2,0x10);
      }
    }
  }
  piVar2 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
    }
  }
  if ((bVar7) &&
     (lcQrequestfactory(),
     ((byte)lcQrequestfactory::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
     )) {
    requestUrl();
  }
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  pqVar1 = &(path->d).size;
  QUrl::QUrl((QUrl *)this,(QUrl *)pqVar1);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery((QUrlQuery *)&local_88,(QUrlQuery *)&local_48);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  QUrl::path(&local_68,pqVar1,0x7f00000);
  QUrl::setUserName((QString *)this,(int)path + 0x38);
  QUrl::setPassword((QString *)this,(int)path + 0x50);
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = 0xaaaaaaaa;
  uStack_a4 = 0xaaaaaaaa;
  uStack_a0 = 0xaaaaaaaa;
  uStack_9c = 0xaaaaaaaa;
  QUrl::path(&local_a8,&local_40,0x7f00000);
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  QUrlQuery::QUrlQuery((QUrlQuery *)&local_b0,&local_40);
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d._0_4_ = 0xaaaaaaaa;
    local_c8.d._4_4_ = 0xaaaaaaaa;
    local_c8.ptr._0_4_ = 0xaaaaaaaa;
    local_c8.ptr._4_4_ = 0xaaaaaaaa;
    QUrlQuery::queryItems(&local_c8,&local_b0,0x1f00000);
    if ((undefined1 *)local_c8.size != (undefined1 *)0x0) {
      pQVar6 = (QString *)CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
      pQVar5 = pQVar6 + local_c8.size * 0x30;
      do {
        QUrlQuery::addQueryItem((QString *)&local_88,pQVar6);
        pQVar6 = pQVar6 + 0x30;
      } while (pQVar6 != pQVar5);
    }
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_c8);
  }
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d._0_4_ = 0xaaaaaaaa;
    local_c8.d._4_4_ = 0xaaaaaaaa;
    local_c8.ptr._0_4_ = 0xaaaaaaaa;
    local_c8.ptr._4_4_ = 0xaaaaaaaa;
    QUrlQuery::queryItems(&local_c8,&path[4].d.ptr,0x1f00000);
    if ((undefined1 *)local_c8.size != (undefined1 *)0x0) {
      pQVar6 = (QString *)CONCAT44(local_c8.ptr._4_4_,local_c8.ptr._0_4_);
      pQVar5 = pQVar6 + local_c8.size * 0x30;
      do {
        QUrlQuery::addQueryItem((QString *)&local_88,pQVar6);
        pQVar6 = pQVar6 + 0x30;
      } while (pQVar6 != pQVar5);
    }
    QArrayDataPointer<std::pair<QString,_QString>_>::~QArrayDataPointer(&local_c8);
  }
  cVar3 = QUrlQuery::isEmpty();
  if (cVar3 == '\0') {
    QUrl::setQuery((QUrlQuery *)this);
  }
  if (local_98 != (undefined1 *)0x0) {
    cVar3 = QString::endsWith((QChar)(char16_t)&local_68,0x2f);
    if ((cVar3 == '\0') ||
       (cVar3 = QString::startsWith((QChar)(char16_t)&local_a8,0x2f), cVar3 == '\0')) {
      cVar3 = QString::startsWith((QChar)(char16_t)&local_a8,0x2f);
      if ((cVar3 == '\0') &&
         (cVar3 = QString::endsWith((QChar)(char16_t)&local_68,0x2f), cVar3 == '\0')) {
        QString::append((QChar)(char16_t)&local_68);
      }
    }
    else {
      QString::chop((longlong)&local_68);
    }
    PVar4 = QString::append((QString *)&local_68);
    QUrl::setPath((QString *)this,PVar4);
  }
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_b0);
  piVar2 = (int *)CONCAT44(uStack_a4,local_a8);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_a4,local_a8),2,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
    }
  }
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_88);
  QUrlQuery::~QUrlQuery((QUrlQuery *)&local_48);
  QUrl::~QUrl(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QNetworkRequestFactoryPrivate::requestUrl(const QString *path,
                                             const QUrlQuery *query) const
{
    const QUrl providedPath = path ? QUrl(*path) : QUrl{};
    const QUrlQuery providedQuery = query ? *query : QUrlQuery();

    if (!providedPath.scheme().isEmpty() || !providedPath.host().isEmpty()) {
        qCWarning(lcQrequestfactory, "The provided path %ls may only contain path and query item "
                  "components, and other parts will be ignored. Set the baseUrl instead",
                  qUtf16Printable(providedPath.toDisplayString()));
    }

    QUrl resultUrl = baseUrl;
    QUrlQuery resultQuery(providedQuery);
    QString basePath = baseUrl.path();

    resultUrl.setUserName(userName);
    resultUrl.setPassword(password);

    // Separate the path and query parameters components on the application-provided path
    const QString requestPath{providedPath.path()};
    const QUrlQuery pathQueryItems{providedPath};

    if (!pathQueryItems.isEmpty()) {
        // Add any query items provided as part of the path
        const auto items = pathQueryItems.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &[key, value]: items)
            resultQuery.addQueryItem(key, value);
    }

    if (!queryParameters.isEmpty()) {
        // Add any query items set to this factory
        const QList<std::pair<QString,QString>> items =
                queryParameters.queryItems(QUrl::ComponentFormattingOption::FullyEncoded);
        for (const auto &item: items)
            resultQuery.addQueryItem(item.first, item.second);
    }

    if (!resultQuery.isEmpty())
        resultUrl.setQuery(resultQuery);

    if (requestPath.isEmpty())
        return resultUrl;

    // Ensure that the "base path" (the path that may be present
    // in the baseUrl), and the request path are joined with one '/'
    // If both have it, remove one, if neither has it, add one
    if (basePath.endsWith(u'/') && requestPath.startsWith(u'/'))
        basePath.chop(1);
    else if (!requestPath.startsWith(u'/') && !basePath.endsWith(u'/'))
        basePath.append(u'/');

    resultUrl.setPath(basePath.append(requestPath));
    return resultUrl;
}